

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

void cmsys::anon_unknown_3::StacktraceSignalHandler(int sigNo,siginfo_t *sigInfo,void *param_3)

{
  __pid_t _Var1;
  uint uVar2;
  ostream *poVar3;
  ulong uVar4;
  int wholePath;
  uint *puVar5;
  char *pcVar6;
  char *pcVar7;
  string local_1b0;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&oss);
  poVar3 = std::operator<<(poVar3,"=========================================================");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar3,"Process id ");
  _Var1 = getpid();
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,_Var1);
  std::operator<<(poVar3," ");
  puVar5 = &switchD_00131572::switchdataD_00139e3c;
  switch(sigNo) {
  case 2:
    pcVar7 = "Caught SIGINT";
    break;
  default:
    wholePath = 0x139e3c;
    poVar3 = std::operator<<((ostream *)&oss,"Caught ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sigNo);
    poVar3 = std::operator<<(poVar3," code ");
    goto LAB_001315ab;
  case 4:
    poVar3 = std::operator<<((ostream *)&oss,"Caught SIGILL at ");
    wholePath = 0x13ab78;
    pcVar7 = "";
    if ((sigInfo->_sifields)._sigfault.si_addr == (void *)0x0) {
      pcVar7 = "0x";
    }
    poVar3 = std::operator<<(poVar3,pcVar7);
    poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
    std::operator<<(poVar3," ");
    uVar2 = sigInfo->si_code - 1;
    if (7 < uVar2) {
      poVar3 = std::operator<<((ostream *)&oss,"code ");
      goto LAB_001315ab;
    }
    uVar4 = (ulong)uVar2;
    puVar5 = (uint *)&DAT_00139f10;
LAB_00131809:
    pcVar7 = (char *)((long)(int)puVar5[uVar4] + (long)puVar5);
    break;
  case 6:
    pcVar7 = "Caught SIGABRT";
    break;
  case 7:
    poVar3 = std::operator<<((ostream *)&oss,"Caught SIGBUS at ");
    wholePath = 0x13ab78;
    pcVar7 = "";
    if ((sigInfo->_sifields)._sigfault.si_addr == (void *)0x0) {
      pcVar7 = "0x";
    }
    poVar3 = std::operator<<(poVar3,pcVar7);
    poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
    std::operator<<(poVar3," ");
    uVar2 = sigInfo->si_code - 1;
    if (uVar2 < 5) {
      uVar4 = (ulong)uVar2;
      puVar5 = (uint *)&DAT_00139efc;
      goto LAB_00131809;
    }
    poVar3 = std::operator<<((ostream *)&oss,"code ");
    goto LAB_001315ab;
  case 8:
    poVar3 = std::operator<<((ostream *)&oss,"Caught SIGFPE at ");
    wholePath = 0x13ab78;
    pcVar7 = "";
    if ((sigInfo->_sifields)._sigfault.si_addr == (void *)0x0) {
      pcVar7 = "0x";
    }
    poVar3 = std::operator<<(poVar3,pcVar7);
    poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
    std::operator<<(poVar3," ");
    uVar2 = sigInfo->si_code - 1;
    if (uVar2 < 8) {
      uVar4 = (ulong)uVar2;
      puVar5 = (uint *)&DAT_00139edc;
      goto LAB_00131809;
    }
    poVar3 = std::operator<<((ostream *)&oss,"code ");
LAB_001315ab:
    std::ostream::operator<<(poVar3,sigInfo->si_code);
    goto LAB_001316a8;
  case 0xb:
    poVar3 = std::operator<<((ostream *)&oss,"Caught SIGSEGV at ");
    pcVar7 = "0x";
    pcVar6 = "";
    if ((sigInfo->_sifields)._sigfault.si_addr == (void *)0x0) {
      pcVar6 = "0x";
    }
    poVar3 = std::operator<<(poVar3,pcVar6);
    poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
    std::operator<<(poVar3," ");
    wholePath = (int)pcVar7;
    puVar5 = (uint *)pcVar7;
    if (sigInfo->si_code == 1) {
      pcVar7 = "address not mapped to object";
    }
    else {
      if (sigInfo->si_code != 2) {
        poVar3 = std::operator<<((ostream *)&oss,"code ");
        goto LAB_001315ab;
      }
      pcVar7 = "invalid permission for mapped object";
    }
    break;
  case 0xf:
    pcVar7 = "Caught SIGTERM";
  }
  wholePath = (int)puVar5;
  std::operator<<((ostream *)&oss,pcVar7);
LAB_001316a8:
  poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&oss);
  poVar3 = std::operator<<(poVar3,"Program Stack:");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  SystemInformationImplementation::GetProgramStack_abi_cxx11_
            (&local_1b0,(SystemInformationImplementation *)0x2,0,wholePath);
  poVar3 = std::operator<<(poVar3,(string *)&local_1b0);
  poVar3 = std::operator<<(poVar3,"=========================================================");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::stringbuf::str();
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&local_1b0);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_1b0);
  SystemInformationImplementation::SetStackTraceOnError(0);
  abort();
}

Assistant:

void StacktraceSignalHandler(
      int sigNo,
      siginfo_t *sigInfo,
      void * /*sigContext*/)
{
#if defined(__linux) || defined(__APPLE__)
  std::ostringstream oss;
  oss
     << std::endl
     << "=========================================================" << std::endl
     << "Process id " << getpid() << " ";
  switch (sigNo)
    {
    case SIGINT:
      oss << "Caught SIGINT";
      break;

    case SIGTERM:
      oss << "Caught SIGTERM";
      break;

    case SIGABRT:
      oss << "Caught SIGABRT";
      break;

    case SIGFPE:
      oss
        << "Caught SIGFPE at "
        << (sigInfo->si_addr==0?"0x":"")
        << sigInfo->si_addr
        <<  " ";
      switch (sigInfo->si_code)
        {
# if defined(FPE_INTDIV)
        case FPE_INTDIV:
          oss << "integer division by zero";
          break;
# endif

# if defined(FPE_INTOVF)
        case FPE_INTOVF:
          oss << "integer overflow";
          break;
# endif

        case FPE_FLTDIV:
          oss << "floating point divide by zero";
          break;

        case FPE_FLTOVF:
          oss << "floating point overflow";
          break;

        case FPE_FLTUND:
          oss << "floating point underflow";
          break;

        case FPE_FLTRES:
          oss << "floating point inexact result";
          break;

        case FPE_FLTINV:
          oss << "floating point invalid operation";
          break;

#if defined(FPE_FLTSUB)
        case FPE_FLTSUB:
          oss << "floating point subscript out of range";
          break;
#endif

        default:
          oss << "code " << sigInfo->si_code;
          break;
        }
      break;

    case SIGSEGV:
      oss
        << "Caught SIGSEGV at "
        << (sigInfo->si_addr==0?"0x":"")
        << sigInfo->si_addr
        <<  " ";
      switch (sigInfo->si_code)
        {
        case SEGV_MAPERR:
          oss << "address not mapped to object";
          break;

        case SEGV_ACCERR:
          oss << "invalid permission for mapped object";
          break;

        default:
          oss << "code " << sigInfo->si_code;
          break;
        }
      break;

    case SIGBUS:
      oss
        << "Caught SIGBUS at "
        << (sigInfo->si_addr==0?"0x":"")
        << sigInfo->si_addr
        <<  " ";
      switch (sigInfo->si_code)
        {
        case BUS_ADRALN:
          oss << "invalid address alignment";
          break;

# if defined(BUS_ADRERR)
        case BUS_ADRERR:
          oss << "nonexistent physical address";
          break;
# endif

# if defined(BUS_OBJERR)
        case BUS_OBJERR:
          oss << "object-specific hardware error";
          break;
# endif

# if defined(BUS_MCEERR_AR)
        case BUS_MCEERR_AR:
          oss << "Hardware memory error consumed on a machine check; action required.";
          break;
# endif

# if defined(BUS_MCEERR_AO)
        case BUS_MCEERR_AO:
          oss << "Hardware memory error detected in process but not consumed; action optional.";
          break;
# endif

        default:
          oss << "code " << sigInfo->si_code;
          break;
        }
      break;

    case SIGILL:
      oss
        << "Caught SIGILL at "
        << (sigInfo->si_addr==0?"0x":"")
        << sigInfo->si_addr
        <<  " ";
      switch (sigInfo->si_code)
        {
        case ILL_ILLOPC:
          oss << "illegal opcode";
          break;

# if defined(ILL_ILLOPN)
        case ILL_ILLOPN:
          oss << "illegal operand";
          break;
# endif

# if defined(ILL_ILLADR)
        case ILL_ILLADR:
          oss << "illegal addressing mode.";
          break;
# endif

        case ILL_ILLTRP:
          oss << "illegal trap";
          break;

        case ILL_PRVOPC:
          oss << "privileged opcode";
          break;

# if defined(ILL_PRVREG)
        case ILL_PRVREG:
          oss << "privileged register";
          break;
# endif

# if defined(ILL_COPROC)
        case ILL_COPROC:
          oss << "co-processor error";
          break;
# endif

# if defined(ILL_BADSTK)
        case ILL_BADSTK:
          oss << "internal stack error";
          break;
# endif

        default:
          oss << "code " << sigInfo->si_code;
          break;
        }
      break;

    default:
      oss << "Caught " << sigNo << " code " << sigInfo->si_code;
      break;
    }
  oss
    << std::endl
    << "Program Stack:" << std::endl
    << SystemInformationImplementation::GetProgramStack(2,0)
    << "=========================================================" << std::endl;
  std::cerr << oss.str() << std::endl;

  // restore the previously registered handlers
  // and abort
  SystemInformationImplementation::SetStackTraceOnError(0);
  abort();
#else
  // avoid warning C4100
  (void)sigNo;
  (void)sigInfo;
#endif
}